

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O0

bool __thiscall
soplex::SPxBoundFlippingRT<double>::getData
          (SPxBoundFlippingRT<double> *this,double *val,int *leaveIdx,int idx,double stab,
          double degeneps,double *upd,double *vec,double *low,double *upp,BreakpointSource src,
          double max)

{
  double *pdVar1;
  double dVar2;
  Status SVar3;
  int in_ECX;
  int *in_RDX;
  double *in_RSI;
  double in_RDI;
  SPxSolverBase<double> *in_R8;
  long in_R9;
  double in_XMM0_Qa;
  Real RVar4;
  double in_XMM1_Qa;
  SPxSolverBase<double> *in_XMM2_Qa;
  long in_stack_00000008;
  long in_stack_00000010;
  double x;
  int in_stack_ffffffffffffff8c;
  double local_68;
  SPxId *id;
  int i;
  bool local_1;
  
  id = (SPxId *)(&(in_R8->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                  super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                  _vptr_ClassArray)[in_ECX];
  RVar4 = spxAbs<double>((Real)id);
  if (in_XMM0_Qa <= RVar4) {
    *in_RDX = in_ECX;
    if ((double)in_XMM2_Qa * (double)id <= 0.0) {
      local_68 = *(double *)(in_stack_00000008 + (long)in_ECX * 8);
    }
    else {
      local_68 = *(double *)(in_stack_00000010 + (long)in_ECX * 8);
    }
    *in_RSI = local_68;
    *in_RSI = (*in_RSI - *(double *)(in_R9 + (long)in_ECX * 8)) / (double)id;
    dVar2 = *(double *)(in_stack_00000010 + (long)in_ECX * 8);
    pdVar1 = (double *)(in_stack_00000008 + (long)in_ECX * 8);
    if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
      if (((0.0 < (double)in_XMM2_Qa) && (*in_RSI < -in_XMM1_Qa)) ||
         (((double)in_XMM2_Qa < 0.0 && (in_XMM1_Qa < *in_RSI)))) {
        *in_RSI = 0.0;
        SPxBasisBase<double>::baseId
                  ((SPxBasisBase<double> *)(*(long *)((long)in_RDI + 8) + 0x1c8),
                   in_stack_ffffffffffffff8c);
        i = (int)((ulong)in_R9 >> 0x20);
        SVar3 = SPxBasisBase<double>::dualStatus((SPxBasisBase<double> *)in_XMM2_Qa,id);
        if (SVar3 != D_ON_BOTH) {
          if ((double)in_XMM2_Qa * (double)id <= 0.0) {
            SPxSolverBase<double>::shiftLBbound(in_XMM2_Qa,(int)((ulong)id >> 0x20),in_RDI);
          }
          else {
            SPxSolverBase<double>::shiftUBbound(in_R8,i,(double)in_XMM2_Qa);
          }
        }
      }
    }
    else {
      *in_RSI = 0.0;
      SPxSolverBase<double>::shiftLBbound(in_XMM2_Qa,(int)((ulong)id >> 0x20),in_RDI);
      SPxSolverBase<double>::shiftUBbound(in_R8,(int)((ulong)in_R9 >> 0x20),(double)in_XMM2_Qa);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SPxBoundFlippingRT<R>::getData(
   R&                 val,
   int&                  leaveIdx,
   int                   idx,
   R                  stab,
   R                  degeneps,
   const R*           upd,
   const R*           vec,
   const R*           low,
   const R*           upp,
   BreakpointSource      src,
   R                  max
)
{
   assert(src == FVEC);

   R x = upd[idx];

   // skip breakpoint if it is too small
   if(spxAbs(x) < stab)
   {
      return false;
   }

   leaveIdx = idx;
   val = (max * x > 0) ? upp[idx] : low[idx];
   val = (val - vec[idx]) / x;

   if(upp[idx] == low[idx])
   {
      val = 0.0;
      this->thesolver->shiftLBbound(idx, vec[idx]);
      this->thesolver->shiftUBbound(idx, vec[idx]);
   }
   else if((max > 0 && val < -degeneps) || (max < 0 && val > degeneps))
   {
      val = 0.0;

      if(this->thesolver->dualStatus(this->thesolver->baseId(idx)) != SPxBasisBase<R>::Desc::D_ON_BOTH)
      {
         if(max * x > 0)
            this->thesolver->shiftUBbound(idx, vec[idx]);
         else
            this->thesolver->shiftLBbound(idx, vec[idx]);
      }
   }

   return true;
}